

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O0

void copyChannel(Image *src,Image *dest,int channel)

{
  Pixel PVar1;
  Pixel *pPVar2;
  int in_EDX;
  Image *in_RSI;
  long in_RDI;
  int x;
  int y;
  int in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  uchar in_stack_ffffffffffffffde;
  undefined1 uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  
  uVar3 = in_RDI != 0 && in_RSI != (Image *)0x0;
  if (in_RDI == 0 || in_RSI == (Image *)0x0) {
    __assert_fail("(src != nullptr) && (dest != nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                  ,0xb5,"void copyChannel(const Image *, Image *, int)");
  }
  checkDimensionsEqualOrThrow(in_RSI,(Image *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  checkValidColorChannelOrThrow((int)((ulong)in_RSI >> 0x20));
  for (uVar5 = 0; uVar5 < *(uint *)(in_RDI + 0x24); uVar5 = uVar5 + 1) {
    for (uVar4 = 0; uVar4 < *(uint *)(in_RDI + 0x20); uVar4 = uVar4 + 1) {
      PVar1 = Image::pixel((Image *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffde,
                                                            CONCAT24(in_stack_ffffffffffffffdc,
                                                                     in_stack_ffffffffffffffd8))),0,
                           0x11ecce);
      in_stack_ffffffffffffffde = (&stack0xffffffffffffffe0)[in_EDX];
      pPVar2 = Image::pixel((Image *)CONCAT44(uVar4,PVar1.colors),
                            CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffde,
                                                    in_stack_ffffffffffffffdc)),
                            in_stack_ffffffffffffffd8);
      pPVar2->colors[in_EDX] = in_stack_ffffffffffffffde;
    }
  }
  return;
}

Assistant:

void copyChannel(const Image *src, Image *dest, int channel) {
  // Check arguments
  assert((src != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Just copy the value.
      dest->pixel(x, y).colors[channel] = src->pixel(x, y).colors[channel];
    }
  }
}